

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

void * buffer_insert_raw(BUFFER *buf,size_t off,size_t n)

{
  int iVar1;
  ulong uVar2;
  void *__src;
  
  uVar2 = buf->size;
  if (buf->alloc < uVar2 + n) {
    iVar1 = buffer_reserve(buf,n);
    if (iVar1 != 0) {
      return (void *)0x0;
    }
    uVar2 = buf->size;
  }
  if (off <= uVar2 && uVar2 - off != 0) {
    __src = (void *)((long)buf->data + off);
    memmove((void *)((long)__src + n),__src,uVar2 - off);
    uVar2 = buf->size;
  }
  buf->size = uVar2 + n;
  return (void *)(off + (long)buf->data);
}

Assistant:

void*
buffer_insert_raw(BUFFER* buf, size_t off, size_t n)
{
    if(buf->size + n > buf->alloc) {
        if(buffer_reserve(buf, n) != 0)
            return NULL;
    }

    if(buf->size > off)
        memmove((uint8_t*)buf->data + off + n, (uint8_t*)buf->data + off, buf->size - off);

    buf->size += n;
    return buffer_data_at(buf, off);
}